

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.h
# Opt level: O2

QueryResult * QueryResult::empty(void)

{
  QueryResult *in_RDI;
  SortedRun local_38;
  
  local_38.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  QueryResult(in_RDI,&local_38);
  SortedRun::~SortedRun(&local_38);
  return in_RDI;
}

Assistant:

static QueryResult empty() { return QueryResult(SortedRun()); }